

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateBuilderMembers
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  FieldDescriptor *field;
  
  field = (this->super_ImmutableEnumFieldGenerator).descriptor_;
  if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) {
    WriteFieldDocComment(printer,field);
    io::Printer::Print(printer,&(this->super_ImmutableEnumFieldGenerator).variables_,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $has_oneof_case_message$;\n}\n"
                      );
    field = (this->super_ImmutableEnumFieldGenerator).descriptor_;
    if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) goto LAB_002c4386;
  }
  WriteFieldDocComment(printer,field);
  pmVar1 = &(this->super_ImmutableEnumFieldGenerator).variables_;
  io::Printer::Print(printer,pmVar1,
                     "$deprecation$public int get$capitalized_name$Value() {\n  if ($has_oneof_case_message$) {\n    return ((java.lang.Integer) $oneof_name$_).intValue();\n  }\n  return $default_number$;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableEnumFieldGenerator).descriptor_);
  io::Printer::Print(printer,pmVar1,
                     "$deprecation$public Builder set$capitalized_name$Value(int value) {\n  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n  $on_changed$\n  return this;\n}\n"
                    );
  field = (this->super_ImmutableEnumFieldGenerator).descriptor_;
LAB_002c4386:
  WriteFieldDocComment(printer,field);
  pmVar1 = &(this->super_ImmutableEnumFieldGenerator).variables_;
  io::Printer::Print(printer,pmVar1,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $type$ result = $type$.$for_number$(\n        (java.lang.Integer) $oneof_name$_);\n    return result == null ? $unknown$ : result;\n  }\n  return $default$;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableEnumFieldGenerator).descriptor_);
  io::Printer::Print(printer,pmVar1,
                     "$deprecation$public Builder set$capitalized_name$($type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  $set_oneof_case_message$;\n  $oneof_name$_ = value.getNumber();\n  $on_changed$\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableEnumFieldGenerator).descriptor_);
  io::Printer::Print(printer,pmVar1,
                     "$deprecation$public Builder clear$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n    $on_changed$\n  }\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $has_oneof_case_message$;\n"
      "}\n");
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public int get$capitalized_name$Value() {\n"
      "  if ($has_oneof_case_message$) {\n"
      "    return ((java.lang.Integer) $oneof_name$_).intValue();\n"
      "  }\n"
      "  return $default_number$;\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public Builder set$capitalized_name$Value(int value) {\n"
      "  $set_oneof_case_message$;\n"
      "  $oneof_name$_ = value;\n"
      "  $on_changed$\n"
      "  return this;\n"
      "}\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    $type$ result = $type$.$for_number$(\n"
    "        (java.lang.Integer) $oneof_name$_);\n"
    "    return result == null ? $unknown$ : result;\n"
    "  }\n"
    "  return $default$;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder set$capitalized_name$($type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  $set_oneof_case_message$;\n"
    "  $oneof_name$_ = value.getNumber();\n"
    "  $on_changed$\n"
    "  return this;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder clear$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    $clear_oneof_case_message$;\n"
    "    $oneof_name$_ = null;\n"
    "    $on_changed$\n"
    "  }\n"
    "  return this;\n"
    "}\n");
}